

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O2

void __thiscall QtMWidgets::MsgBoxButton::paintEvent(MsgBoxButton *this,QPaintEvent *param_1)

{
  MsgBoxButtonPrivate *pMVar1;
  QPalette *pQVar2;
  QColor *pQVar3;
  QRect QVar4;
  QPainter p;
  QRect local_50;
  QColor c;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  pQVar2 = (QPalette *)QWidget::palette();
  QPalette::color(pQVar2,WindowText);
  QPainter::setPen((QColor *)&p);
  QVar4 = QWidget::rect((QWidget *)this);
  c._0_8_ = (BADTYPE)QVar4.x1;
  c._8_8_ = (BADTYPE)QVar4.y1;
  pMVar1 = (this->d).d;
  QTextOption::QTextOption((QTextOption *)&local_50,0x84);
  QPainter::drawText((QRectF *)&p,(QString *)&c,(QTextOption *)&pMVar1->text);
  QTextOption::~QTextOption((QTextOption *)&local_50);
  if (((this->d).d)->pressed == true) {
    pQVar2 = (QPalette *)QWidget::palette();
    pQVar3 = QPalette::color(pQVar2,Highlight);
    c._0_8_ = *(undefined8 *)pQVar3;
    c._8_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
    QColor::setAlpha((int)&c);
    QPainter::setPen((PenStyle)&p);
    QBrush::QBrush((QBrush *)&local_50,&c,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush((QBrush *)&local_50);
    local_50 = QWidget::rect((QWidget *)this);
    QPainter::drawRect(&p,&local_50);
  }
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
MsgBoxButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	p.setPen( palette().color( QPalette::WindowText ) );

	p.drawText( rect(), d->text, QTextOption( Qt::AlignCenter ) );

	if( d->pressed )
	{
		QColor c = palette().color( QPalette::Highlight );
		c.setAlpha( 75 );

		p.setPen( Qt::NoPen );
		p.setBrush( c );
		p.drawRect( rect() );
	}
}